

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

void __thiscall
option::PrintUsageImplementation::LineWrapper::process
          (LineWrapper *this,IStringWriter *write,char *data,int len)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint ch;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  this->wrote_something = false;
  if (0 < len) {
LAB_0010d905:
    iVar6 = this->width;
    if (len <= iVar6) goto LAB_0010da23;
    uVar8 = 0;
    uVar5 = uVar8;
    if (0 < iVar6) {
      iVar9 = 0;
      do {
        iVar7 = (int)uVar8;
        bVar1 = data[uVar8];
        uVar4 = 1;
        if ((0xc1 < bVar1) && (iVar7 + 1 < len)) {
          uVar4 = bVar1 ^ 0xff;
          iVar2 = 0x1f;
          if (uVar4 != 0) {
            for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
            }
          }
          ch = ((uint)bVar1 << (~(byte)iVar2 & 0x1f)) >> (~(byte)iVar2 & 0x1f);
          uVar5 = 1;
          do {
            uVar4 = (uint)uVar5;
            if (0x3f < ((byte)data[iVar7 + (uint)uVar5] ^ 0x80)) break;
            ch = ch << 6 ^ (uint)(byte)data[iVar7 + (uint)uVar5] ^ 0x80;
            uVar5 = uVar5 + 1;
            uVar4 = len - iVar7;
          } while ((uint)(len - iVar7) != uVar5);
          if (0x10ff < ch) {
            bVar3 = isWideChar(ch);
            iVar6 = this->width;
            if (bVar3) {
              if (iVar6 < iVar9 + 2) goto LAB_0010d9c1;
              iVar9 = iVar9 + 1;
            }
          }
        }
        uVar8 = (ulong)(iVar7 + uVar4);
        if ((len <= (int)(iVar7 + uVar4)) || (iVar9 = iVar9 + 1, iVar6 <= iVar9)) goto LAB_0010d9c1;
      } while( true );
    }
    goto LAB_0010d9d2;
  }
LAB_0010da4c:
  write_one_line(this,write);
  return;
LAB_0010d9c1:
  if ((int)uVar8 == len) {
LAB_0010da23:
    output(this,write,data,len);
    goto LAB_0010da33;
  }
  uVar5 = uVar8;
  if (-1 < (int)uVar8) {
LAB_0010d9d2:
    do {
      iVar6 = (int)uVar5;
      if (data[uVar5] == ' ') {
        output(this,write,data,iVar6);
        uVar8 = (ulong)(iVar6 + 1);
        goto LAB_0010da12;
      }
      uVar5 = (ulong)(iVar6 - 1);
    } while (0 < iVar6);
  }
  output(this,write,data,(int)uVar8);
LAB_0010da12:
  data = data + uVar8;
  iVar6 = len - (int)uVar8;
  bVar3 = len < (int)uVar8;
  len = iVar6;
  if (iVar6 == 0 || bVar3) goto LAB_0010da33;
  goto LAB_0010d905;
LAB_0010da33:
  if ((this->wrote_something & 1U) != 0) {
    return;
  }
  goto LAB_0010da4c;
}

Assistant:

void process(IStringWriter& write, const char* data, int len)
    {
      wrote_something = false;

      while (len > 0)
      {
        if (len <= width) // quick test that works because utf8width <= len (all wide chars have at least 2 bytes)
        {
          output(write, data, len);
          len = 0;
        }
        else // if (len > width)  it's possible (but not guaranteed) that utf8len > width
        {
          int utf8width = 0;
          int maxi = 0;
          while (maxi < len && utf8width < width)
          {
            int charbytes = 1;
            unsigned ch = (unsigned char) data[maxi];
            if (ch > 0xC1) // everything <= 0xC1 (yes, even 0xC1 itself) is not a valid UTF-8 start byte
            {
              // int __builtin_clz (unsigned int x)
              // Returns the number of leading 0-bits in x, starting at the most significant bit
              unsigned mask = (unsigned) -1 >> __builtin_clz(ch ^ 0xff);
              ch = ch & mask; // mask out length bits, we don't verify their correctness
              while ((maxi + charbytes < len) && //
                  (((unsigned char) data[maxi + charbytes] ^ 0x80) <= 0x3F)) // while next byte is continuation byte
              {
                ch = (ch << 6) ^ (unsigned char) data[maxi + charbytes] ^ 0x80; // add continuation to char code
                ++charbytes;
              }
              // ch is the decoded unicode code point
              if (ch >= 0x1100 && isWideChar(ch)) // the test for 0x1100 is here to avoid the function call in the Latin case
              {
                if (utf8width + 2 > width)
                  break;
                ++utf8width;
              }
            }
            ++utf8width;
            maxi += charbytes;
          }

          // data[maxi-1] is the last byte of the UTF-8 sequence of the last character that fits
          // onto the 1st line. If maxi == len, all characters fit on the line.

          if (maxi == len)
          {
            output(write, data, len);
            len = 0;
          }
          else // if (maxi < len)  at least 1 character (data[maxi] that is) doesn't fit on the line
          {
            int i;
            for (i = maxi; i >= 0; --i)
              if (data[i] == ' ')
                break;

            if (i >= 0)
            {
              output(write, data, i);
              data += i + 1;
              len -= i + 1;
            }
            else // did not find a space to split at => split before data[maxi]
            { // data[maxi] is always the beginning of a character, never a continuation byte
              output(write, data, maxi);
              data += maxi;
              len -= maxi;
            }
          }
        }
      }
      if (!wrote_something) // if we didn't already write something to make space in the buffer
        write_one_line(write); // write at most one line of actual output
    }